

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_not_slow(JSContext *ctx,JSValue *sp)

{
  int iVar1;
  JSValueUnion JVar2;
  int64_t iStack_20;
  int32_t v1;
  
  iVar1 = JS_ToInt32Free(ctx,&v1,sp[-1]);
  if (iVar1 == 0) {
    JVar2._0_4_ = ~v1;
    JVar2._4_4_ = 0;
    sp[-1].u = JVar2;
    iStack_20 = 0;
    iVar1 = 0;
  }
  else {
    sp[-1].u.int32 = 0;
    iVar1 = -1;
    iStack_20 = 3;
  }
  sp[-1].tag = iStack_20;
  return iVar1;
}

Assistant:

static no_inline int js_not_slow(JSContext *ctx, JSValue *sp)
{
    int32_t v1;

    if (unlikely(JS_ToInt32Free(ctx, &v1, sp[-1]))) {
        sp[-1] = JS_UNDEFINED;
        return -1;
    }
    sp[-1] = JS_NewInt32(ctx, ~v1);
    return 0;
}